

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int ConnectMTx(MT *pMT,char *szCfgFilePath)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (addrsMT[lVar2] == (void *)0x0) {
      iVar1 = ConnectMT(pMT,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsMT[lVar2] = pMT;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectMTx(MT* pMT, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsMT[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectMT(pMT, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsMT[id] = pMT;

	return EXIT_SUCCESS;
}